

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

int multi_getsock(Curl_easy *data,curl_socket_t *socks)

{
  connectdata *conn;
  _func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  long lVar6;
  
  conn = data->conn;
  uVar2 = 0;
  uVar4 = 0;
  if (conn != (connectdata *)0x0) {
    uVar4 = uVar2;
    switch(data->mstate) {
    case MSTATE_RESOLVING:
      iVar3 = Curl_resolv_getsock(data,socks);
      return iVar3;
    case MSTATE_CONNECTING:
      if (((conn->http_proxy).proxytype == '\x02') && ((conn->bits).proxy_ssl_connected[0] == false)
         ) {
        iVar3 = (*Curl_ssl->getsock)(conn,socks);
        return iVar3;
      }
      if ((conn->cnnct).state - CONNECT_SOCKS_INIT < 0x10) {
        iVar3 = Curl_SOCKS_getsock(conn,socks,0);
        return iVar3;
      }
      lVar6 = 0;
      uVar4 = 0;
      iVar3 = 0;
      bVar1 = true;
      do {
        bVar5 = bVar1;
        if (conn->tempsock[lVar6] != -1) {
          socks[iVar3] = conn->tempsock[lVar6];
          uVar4 = uVar4 | 1 << (iVar3 + 0x10U & 0x1f);
          iVar3 = iVar3 + 1;
        }
        lVar6 = 1;
        bVar1 = false;
      } while (bVar5);
      break;
    case MSTATE_TUNNELING:
      *socks = conn->sock[0];
      if (conn->connect_state == (http_connect_state *)0x0) {
        return 0x10000;
      }
      iVar3 = Curl_connect_getsock(conn);
      return iVar3;
    case MSTATE_PROTOCONNECT:
    case MSTATE_PROTOCONNECTING:
      UNRECOVERED_JUMPTABLE = conn->handler->proto_getsock;
      if (UNRECOVERED_JUMPTABLE == (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0)
      {
        *socks = conn->sock[0];
        return 0x10001;
      }
      iVar3 = (*UNRECOVERED_JUMPTABLE)(data,conn,socks);
      return iVar3;
    case MSTATE_DO:
    case MSTATE_DOING:
      UNRECOVERED_JUMPTABLE = conn->handler->doing_getsock;
      if (UNRECOVERED_JUMPTABLE != (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0)
      {
        iVar3 = (*UNRECOVERED_JUMPTABLE)(data,conn,socks);
        return iVar3;
      }
      break;
    case MSTATE_DOING_MORE:
      UNRECOVERED_JUMPTABLE = conn->handler->domore_getsock;
      if (UNRECOVERED_JUMPTABLE != (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0)
      {
        iVar3 = (*UNRECOVERED_JUMPTABLE)(data,conn,socks);
        return iVar3;
      }
      break;
    case MSTATE_DID:
    case MSTATE_PERFORMING:
      iVar3 = Curl_single_getsock(data,conn,socks);
      return iVar3;
    }
  }
  return uVar4;
}

Assistant:

static int multi_getsock(struct Curl_easy *data,
                         curl_socket_t *socks)
{
  struct connectdata *conn = data->conn;
  /* The no connection case can happen when this is called from
     curl_multi_remove_handle() => singlesocket() => multi_getsock().
  */
  if(!conn)
    return 0;

  switch(data->mstate) {
  default:
    return 0;

  case MSTATE_RESOLVING:
    return Curl_resolv_getsock(data, socks);

  case MSTATE_PROTOCONNECTING:
  case MSTATE_PROTOCONNECT:
    return protocol_getsock(data, conn, socks);

  case MSTATE_DO:
  case MSTATE_DOING:
    return doing_getsock(data, conn, socks);

  case MSTATE_TUNNELING:
    return waitproxyconnect_getsock(conn, socks);

  case MSTATE_CONNECTING:
    return waitconnect_getsock(conn, socks);

  case MSTATE_DOING_MORE:
    return domore_getsock(data, conn, socks);

  case MSTATE_DID: /* since is set after DO is completed, we switch to
                        waiting for the same as the PERFORMING state */
  case MSTATE_PERFORMING:
    return Curl_single_getsock(data, conn, socks);
  }

}